

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall
discordpp::TeamMember::TeamMember
          (TeamMember *this,field<int> *membership_state,
          field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *permissions,field<discordpp::Snowflake> *team_id,field<discordpp::User> *user)

{
  field<discordpp::User> *user_local;
  field<discordpp::Snowflake> *team_id_local;
  field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *permissions_local;
  field<int> *membership_state_local;
  TeamMember *this_local;
  
  field<int>::field(&this->membership_state,membership_state);
  field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::field(&this->permissions,permissions);
  field<discordpp::Snowflake>::field(&this->team_id,team_id);
  field<discordpp::User>::field(&this->user,user);
  return;
}

Assistant:

TeamMember(
        field<int> membership_state = uninitialized,
        field<std::vector<std::string> > permissions = uninitialized,
        field<Snowflake> team_id = uninitialized,
        field<User> user = uninitialized
    ):
        membership_state(membership_state),
        permissions(permissions),
        team_id(team_id),
        user(user)
    {}